

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PassManager.cc
# Opt level: O2

void __thiscall flow::PassManager::run(PassManager *this,IRProgram *program)

{
  pointer puVar1;
  IRHandler *handler;
  pointer puVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  puVar1 = (program->handlers_).
           super__Vector_base<std::unique_ptr<flow::IRHandler,_std::default_delete<flow::IRHandler>_>,_std::allocator<std::unique_ptr<flow::IRHandler,_std::default_delete<flow::IRHandler>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (puVar2 = (program->handlers_).
                super__Vector_base<std::unique_ptr<flow::IRHandler,_std::default_delete<flow::IRHandler>_>,_std::allocator<std::unique_ptr<flow::IRHandler,_std::default_delete<flow::IRHandler>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start; puVar2 != puVar1; puVar2 = puVar2 + 1) {
    handler = (puVar2->_M_t).
              super___uniq_ptr_impl<flow::IRHandler,_std::default_delete<flow::IRHandler>_>._M_t.
              super__Tuple_impl<0UL,_flow::IRHandler_*,_std::default_delete<flow::IRHandler>_>.
              super__Head_base<0UL,_flow::IRHandler_*,_false>._M_head_impl;
    std::__cxx11::string::string
              ((string *)&local_50,(string *)((long)&(handler->super_Constant).super_Value + 0x10));
    logDebug<std::__cxx11::string>(this,"optimizing handler {}",&local_50);
    std::__cxx11::string::~string((string *)&local_50);
    run(this,handler);
  }
  return;
}

Assistant:

void PassManager::run(IRProgram* program) {
  for (IRHandler* handler : program->handlers()) {
    logDebug("optimizing handler {}", handler->name());
    run(handler);
  }
}